

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

void __thiscall
QSocks5BindStore::add(QSocks5BindStore *this,qintptr socketDescriptor,QSocks5BindData *bindData)

{
  long lVar1;
  bool bVar2;
  Duration in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QRecursiveMutex> lock;
  QRecursiveMutex *in_stack_ffffffffffffff98;
  QMutexLocker<QRecursiveMutex> *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QRecursiveMutex>::QMutexLocker(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  QHash<long_long,_QSocks5BindData_*>::contains
            ((QHash<long_long,_QSocks5BindData_*> *)in_RDI.__r,(longlong *)in_stack_ffffffffffffffa0
            );
  QElapsedTimer::start();
  QHash<long_long,_QSocks5BindData_*>::insert
            ((QHash<long_long,_QSocks5BindData_*> *)in_stack_ffffffffffffffa0,
             (longlong *)in_stack_ffffffffffffff98,(QSocks5BindData **)0x36ea46);
  bVar2 = QBasicTimer::isActive((QBasicTimer *)(in_RDI.__r + 0x28));
  if (!bVar2) {
    in_stack_ffffffffffffffa0 = (QMutexLocker<QRecursiveMutex> *)(in_RDI.__r + 0x28);
    min<(char)49>();
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<60l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffffa0,
               (duration<long,_std::ratio<60L,_1L>_> *)in_stack_ffffffffffffff98);
    QBasicTimer::start((QBasicTimer *)in_stack_ffffffffffffff98,in_RDI,(QObject *)0x36ea9d);
  }
  QMutexLocker<QRecursiveMutex>::~QMutexLocker(in_stack_ffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSocks5BindStore::add(qintptr socketDescriptor, QSocks5BindData *bindData)
{
    QMutexLocker lock(&mutex);
    if (store.contains(socketDescriptor)) {
        // qDebug("delete it");
    }
    bindData->timeStamp.start();
    store.insert(socketDescriptor, bindData);

    // start sweep timer if not started
    if (!sweepTimer.isActive())
        sweepTimer.start(1min, this);
}